

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

unsigned_long zng_deflateBound(zng_stream *strm,unsigned_long sourceLen)

{
  uint8_t uVar1;
  uint uVar2;
  internal_state *piVar3;
  zng_gz_headerp pzVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  long lVar11;
  ulong uStack_40;
  
  uVar9 = sourceLen + 7 >> 3;
  lVar11 = sourceLen + uVar9;
  uVar7 = sourceLen + 0x3f >> 6;
  iVar5 = deflateStateCheck(strm);
  if (iVar5 == 0) {
    piVar3 = strm->state;
    uVar2 = piVar3->wrap;
    uStack_40 = (ulong)uVar2;
    if ((ulong)uVar2 != 0) {
      if (uVar2 == 2) {
        pzVar4 = piVar3->gzhead;
        if (pzVar4 == (zng_gz_headerp)0x0) {
          uStack_40 = 0x12;
        }
        else {
          if (pzVar4->extra == (uint8_t *)0x0) {
            uVar8 = 0x12;
          }
          else {
            uVar8 = (ulong)(pzVar4->extra_len + 2) + 0x12;
          }
          puVar6 = pzVar4->name;
          if (puVar6 != (uint8_t *)0x0) {
            do {
              uVar8 = uVar8 + 1;
              uVar1 = *puVar6;
              puVar6 = puVar6 + 1;
            } while (uVar1 != '\0');
          }
          puVar6 = pzVar4->comment;
          if (puVar6 != (uint8_t *)0x0) {
            do {
              uVar8 = uVar8 + 1;
              uVar1 = *puVar6;
              puVar6 = puVar6 + 1;
            } while (uVar1 != '\0');
          }
          uStack_40 = uVar8 + 2;
          if (pzVar4->hcrc == 0) {
            uStack_40 = uVar8;
          }
        }
      }
      else if (uVar2 == 1) {
        uStack_40 = (ulong)(piVar3->strstart != 0) * 4 + 6;
      }
      else {
        uStack_40 = 6;
      }
    }
    if (piVar3->w_bits == 0xf) {
      uVar10 = uStack_40 + (sourceLen < 9) + sourceLen + (ulong)(sourceLen == 0) + uVar9 + 3;
    }
    else {
      if (piVar3->level == 0) {
        lVar11 = sourceLen + 7 + (sourceLen >> 5) + (sourceLen >> 0xb) + (sourceLen >> 7);
      }
      else {
        lVar11 = lVar11 + uVar7 + 5;
      }
      uVar10 = lVar11 + uStack_40;
    }
  }
  else {
    uVar10 = lVar11 + uVar7 + 0xb;
  }
  return uVar10;
}

Assistant:

unsigned long Z_EXPORT PREFIX(deflateBound)(PREFIX3(stream) *strm, unsigned long sourceLen) {
    deflate_state *s;
    unsigned long complen, wraplen;

    /* conservative upper bound for compressed data */
    complen = sourceLen + ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;
    DEFLATE_BOUND_ADJUST_COMPLEN(strm, complen, sourceLen);  /* hook for IBM Z DFLTCC */

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (deflateStateCheck(strm))
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = ZLIB_WRAPLEN + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = GZIP_WRAPLEN;
        if (s->gzhead != NULL) {            /* user-supplied gzip header */
            unsigned char *str;
            if (s->gzhead->extra != NULL) {
                wraplen += 2 + s->gzhead->extra_len;
            }
            str = s->gzhead->name;
            if (str != NULL) {
                do {
                    wraplen++;
                } while (*str++);
            }
            str = s->gzhead->comment;
            if (str != NULL) {
                do {
                    wraplen++;
                } while (*str++);
            }
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = ZLIB_WRAPLEN;
    }

    /* if not default parameters, return conservative bound */
    if (DEFLATE_NEED_CONSERVATIVE_BOUND(strm) ||  /* hook for IBM Z DFLTCC */
            s->w_bits != MAX_WBITS || HASH_BITS < 15) {
        if (s->level == 0) {
            /* upper bound for stored blocks with length 127 (memLevel == 1) --
               ~4% overhead plus a small constant */
            complen = sourceLen + (sourceLen >> 5) + (sourceLen >> 7) + (sourceLen >> 11) + 7;
        }

        return complen + wraplen;
    }

#ifndef NO_QUICK_STRATEGY
    return sourceLen                       /* The source size itself */
      + (sourceLen == 0 ? 1 : 0)           /* Always at least one byte for any input */
      + (sourceLen < 9 ? 1 : 0)            /* One extra byte for lengths less than 9 */
      + DEFLATE_QUICK_OVERHEAD(sourceLen)  /* Source encoding overhead, padded to next full byte */
      + DEFLATE_BLOCK_OVERHEAD             /* Deflate block overhead bytes */
      + wraplen;                           /* none, zlib or gzip wrapper */
#else
    return sourceLen + (sourceLen >> 4) + 7 + wraplen;
#endif
}